

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O0

double __thiscall
mp::BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
::Visit(BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
        *this,Expr e)

{
  Kind KVar1;
  NumericConstant NVar2;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71> e_00;
  ExprBase e_01;
  BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
  *in_RSI;
  ExprBase in_RDI;
  BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
  *in_stack_fffffffffffffb78;
  ExprBase in_stack_fffffffffffffb80;
  RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector> *in_stack_fffffffffffffba0;
  ExprBase in_stack_fffffffffffffba8;
  double local_8;
  
  KVar1 = internal::ExprBase::kind((ExprBase *)0x1c9be0);
  e_01.impl_._4_4_ = 0;
  e_01.impl_._0_4_ = KVar1 - FIRST_EXPR;
  switch(e_01.impl_) {
  default:
    NVar2 = internal::ExprTypes::UncheckedCast<mp::NumericConstant>((Expr)in_RDI.impl_);
    local_8 = anon_unknown_19::VariableCollector::VisitNumericConstant
                        ((VariableCollector *)in_RDI.impl_,
                         (NumericConstant)
                         NVar2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                         impl_);
    break;
  case (Impl *)0x1:
    internal::ExprTypes::UncheckedCast<mp::Reference>((Expr)in_RDI.impl_);
    local_8 = internal::RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>::
              VisitVariable(in_stack_fffffffffffffba0,(Reference)in_stack_fffffffffffffba8.impl_);
    break;
  case (Impl *)0x2:
    internal::ExprTypes::UncheckedCast<mp::Reference>((Expr)in_RDI.impl_);
    local_8 = VisitCommonExpr(in_stack_fffffffffffffb78,(CommonExpr)in_stack_fffffffffffffb80.impl_)
    ;
    break;
  case (Impl *)0x3:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitMinus((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x4:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAbs((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x5:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitFloor((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x6:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitCeil((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x7:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitSqrt((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x8:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitPow2((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x9:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitExp((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0xa:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitLog((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0xb:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitLog10((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0xc:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitSin((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0xd:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitSinh((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0xe:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitCos((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0xf:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitCosh((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x10:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitTan((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x11:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitTanh((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x12:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAsin((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x13:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAsinh((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x14:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAcos((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x15:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAcosh((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x16:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAtan((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x17:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAtanh((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(UnaryExpr)e_01.impl_);
    break;
  case (Impl *)0x18:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAdd((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x19:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitSub((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x1a:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitLess((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                         *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x1b:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitMul((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x1c:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitDiv((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x1d:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitTruncDiv((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                             *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x1e:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitMod((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x1f:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitPow((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x20:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitPowConstBase((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                                 *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x21:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitPowConstExp((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                                *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x22:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAtan2((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x23:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitPrecision((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                              *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x24:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitRound((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x25:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitTrunc((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                          *)in_RDI.impl_,(BinaryExpr)e_01.impl_);
    break;
  case (Impl *)0x26:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitIf(in_stack_fffffffffffffb78,(IfExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x27:
    internal::ExprTypes::UncheckedCast<mp::PLTerm>((Expr)in_RDI.impl_);
    local_8 = VisitPLTerm(in_stack_fffffffffffffb78,(PLTerm)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x28:
    internal::ExprTypes::UncheckedCast<mp::CallExpr>((Expr)in_RDI.impl_);
    local_8 = VisitCall(in_stack_fffffffffffffb78,(CallExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x29:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitMin((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(VarArgExpr)e_01.impl_);
    break;
  case (Impl *)0x2a:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitMax((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(VarArgExpr)e_01.impl_);
    break;
  case (Impl *)0x2b:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitSum(in_stack_fffffffffffffb78,(SumExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x2c:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitNumberOf(in_stack_fffffffffffffb78,(NumberOfExpr)in_stack_fffffffffffffb80.impl_)
    ;
    break;
  case (Impl *)0x2d:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitNumberOfSym(in_stack_fffffffffffffb78,
                               (SymbolicNumberOfExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x2e:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitCount(in_stack_fffffffffffffb78,(CountExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x2f:
    internal::ExprTypes::UncheckedCast<mp::LogicalConstant>((Expr)in_RDI.impl_);
    local_8 = VisitLogicalConstant
                        (in_stack_fffffffffffffb78,(LogicalConstant)in_stack_fffffffffffffb80.impl_)
    ;
    break;
  case (Impl *)0x30:
    internal::ExprTypes::
    UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitNot(in_stack_fffffffffffffb78,(NotExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x31:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitOr((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                       *)in_RDI.impl_,(BinaryLogicalExpr)e_01.impl_);
    break;
  case (Impl *)0x32:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAnd((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(BinaryLogicalExpr)e_01.impl_);
    break;
  case (Impl *)0x33:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitIff((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)in_RDI.impl_,(BinaryLogicalExpr)e_01.impl_);
    break;
  case (Impl *)0x34:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitLT((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                       *)in_RDI.impl_,(RelationalExpr)e_01.impl_);
    break;
  case (Impl *)0x35:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitLE((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                       *)in_RDI.impl_,(RelationalExpr)e_01.impl_);
    break;
  case (Impl *)0x36:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitEQ((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                       *)in_RDI.impl_,(RelationalExpr)e_01.impl_);
    break;
  case (Impl *)0x37:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitGE((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                       *)in_RDI.impl_,(RelationalExpr)e_01.impl_);
    break;
  case (Impl *)0x38:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitGT((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                       *)in_RDI.impl_,(RelationalExpr)e_01.impl_);
    break;
  case (Impl *)0x39:
    internal::ExprTypes::
    UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitNE((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                       *)in_RDI.impl_,(RelationalExpr)e_01.impl_);
    break;
  case (Impl *)0x3a:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_RDI.impl_);
    local_8 = VisitAtLeast((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                            *)in_RDI.impl_,(LogicalCountExpr)e_01.impl_);
    break;
  case (Impl *)0x3b:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_RDI.impl_);
    local_8 = VisitAtMost((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                           *)in_RDI.impl_,(LogicalCountExpr)e_01.impl_);
    break;
  case (Impl *)0x3c:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_RDI.impl_);
    local_8 = VisitExactly((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                            *)in_RDI.impl_,(LogicalCountExpr)e_01.impl_);
    break;
  case (Impl *)0x3d:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_RDI.impl_);
    local_8 = VisitNotAtLeast((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                               *)in_RDI.impl_,(LogicalCountExpr)e_01.impl_);
    break;
  case (Impl *)0x3e:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_RDI.impl_);
    local_8 = VisitNotAtMost((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                              *)in_RDI.impl_,(LogicalCountExpr)e_01.impl_);
    break;
  case (Impl *)0x3f:
    internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>((Expr)in_RDI.impl_);
    local_8 = VisitNotExactly((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                               *)in_RDI.impl_,(LogicalCountExpr)e_01.impl_);
    break;
  case (Impl *)0x40:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitImplication(in_stack_fffffffffffffb78,
                               (ImplicationExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x41:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitExists((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                           *)in_RDI.impl_,(IteratedLogicalExpr)e_01.impl_);
    break;
  case (Impl *)0x42:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitForAll((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                           *)in_RDI.impl_,(IteratedLogicalExpr)e_01.impl_);
    break;
  case (Impl *)0x43:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitAllDiff(in_stack_fffffffffffffb78,(PairwiseExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x44:
    internal::ExprTypes::
    UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
              ((Expr)in_RDI.impl_);
    local_8 = VisitNotAllDiff(in_stack_fffffffffffffb78,
                              (PairwiseExpr)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x45:
    internal::ExprTypes::UncheckedCast<mp::StringLiteral>((Expr)in_RDI.impl_);
    local_8 = VisitStringLiteral(in_stack_fffffffffffffb78,
                                 (StringLiteral)in_stack_fffffffffffffb80.impl_);
    break;
  case (Impl *)0x46:
    e_00 = internal::ExprTypes::
           UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>
                     ((Expr)in_RDI.impl_);
    local_8 = VisitSymbolicIf(in_RSI,(SymbolicIfExpr)
                                     e_00.super_BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71>.
                                     super_ExprBase.impl_);
  }
  return local_8;
}

Assistant:

Result BasicExprVisitor<Impl, Result, ET>::Visit(Expr e) {
  // All expressions except OPNUMBEROFs and OPIFSYM are supported.
  switch (e.kind()) {
  default:
    MP_ASSERT(false, "invalid expression");
    // Fall through.
  case expr::NUMBER:
    return MP_DISPATCH(VisitNumericConstant(
                         ET::template UncheckedCast<NumericConstant>(e)));
  case expr::VARIABLE:
    return MP_DISPATCH(VisitVariable(ET::template UncheckedCast<Variable>(e)));
  case expr::COMMON_EXPR:
    return MP_DISPATCH(VisitCommonExpr(
                         ET::template UncheckedCast<CommonExpr>(e)));

  // Unary expressions.
  case expr::MINUS:
    return MP_DISPATCH(VisitMinus(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ABS:
    return MP_DISPATCH(VisitAbs(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::FLOOR:
    return MP_DISPATCH(VisitFloor(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::CEIL:
    return MP_DISPATCH(VisitCeil(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SQRT:
    return MP_DISPATCH(VisitSqrt(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::POW2:
    return MP_DISPATCH(VisitPow2(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::EXP:
    return MP_DISPATCH(VisitExp(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG:
    return MP_DISPATCH(VisitLog(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG10:
    return MP_DISPATCH(VisitLog10(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SIN:
    return MP_DISPATCH(VisitSin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SINH:
    return MP_DISPATCH(VisitSinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COS:
    return MP_DISPATCH(VisitCos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COSH:
    return MP_DISPATCH(VisitCosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TAN:
    return MP_DISPATCH(VisitTan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TANH:
    return MP_DISPATCH(VisitTanh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASIN:
    return MP_DISPATCH(VisitAsin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASINH:
    return MP_DISPATCH(VisitAsinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOS:
    return MP_DISPATCH(VisitAcos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOSH:
    return MP_DISPATCH(VisitAcosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATAN:
    return MP_DISPATCH(VisitAtan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATANH:
    return MP_DISPATCH(VisitAtanh(ET::template UncheckedCast<UnaryExpr>(e)));

  // Binary expressions.
  case expr::ADD:
    return MP_DISPATCH(VisitAdd(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::SUB:
    return MP_DISPATCH(VisitSub(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::LESS:
    return MP_DISPATCH(VisitLess(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MUL:
    return MP_DISPATCH(VisitMul(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::DIV:
    return MP_DISPATCH(VisitDiv(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC_DIV:
    return MP_DISPATCH(VisitTruncDiv(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MOD:
    return MP_DISPATCH(VisitMod(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW:
    return MP_DISPATCH(VisitPow(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_BASE:
    return MP_DISPATCH(VisitPowConstBase(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_EXP:
    return MP_DISPATCH(VisitPowConstExp(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ATAN2:
    return MP_DISPATCH(VisitAtan2(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::PRECISION:
    return MP_DISPATCH(VisitPrecision(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ROUND:
    return MP_DISPATCH(VisitRound(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC:
    return MP_DISPATCH(VisitTrunc(ET::template UncheckedCast<BinaryExpr>(e)));

  case expr::IF:
    return MP_DISPATCH(VisitIf(ET::template UncheckedCast<IfExpr>(e)));
  case expr::PLTERM:
    return MP_DISPATCH(VisitPLTerm(ET::template UncheckedCast<PLTerm>(e)));
  case expr::CALL:
    return MP_DISPATCH(VisitCall(ET::template UncheckedCast<CallExpr>(e)));
  case expr::MIN:
    return MP_DISPATCH(VisitMin(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::MAX:
    return MP_DISPATCH(VisitMax(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::SUM:
    return MP_DISPATCH(VisitSum(ET::template UncheckedCast<SumExpr>(e)));
  case expr::NUMBEROF:
    return MP_DISPATCH(VisitNumberOf(
                         ET::template UncheckedCast<NumberOfExpr>(e)));
  case expr::NUMBEROF_SYM:
    return MP_DISPATCH(VisitNumberOfSym(
                         ET::template UncheckedCast<SymbolicNumberOfExpr>(e)));
  case expr::COUNT:
    return MP_DISPATCH(VisitCount(ET::template UncheckedCast<CountExpr>(e)));

    // Logical expressions.
  case expr::BOOL:
    return MP_DISPATCH(VisitLogicalConstant(
                         ET::template UncheckedCast<LogicalConstant>(e)));
  case expr::NOT:
    return MP_DISPATCH(VisitNot(ET::template UncheckedCast<NotExpr>(e)));
  case expr::OR:
    return MP_DISPATCH(VisitOr(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::AND:
    return MP_DISPATCH(VisitAnd(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::IFF:
    return MP_DISPATCH(VisitIff(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::LT:
    return MP_DISPATCH(VisitLT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::LE:
    return MP_DISPATCH(VisitLE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::EQ:
    return MP_DISPATCH(VisitEQ(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GE:
    return MP_DISPATCH(VisitGE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GT:
    return MP_DISPATCH(VisitGT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::NE:
    return MP_DISPATCH(VisitNE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::ATLEAST:
    return MP_DISPATCH(VisitAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::ATMOST:
    return MP_DISPATCH(VisitAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::EXACTLY:
    return MP_DISPATCH(VisitExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATLEAST:
    return MP_DISPATCH(VisitNotAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATMOST:
    return MP_DISPATCH(VisitNotAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_EXACTLY:
    return MP_DISPATCH(VisitNotExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::IMPLICATION:
    return MP_DISPATCH(VisitImplication(
                         ET::template UncheckedCast<ImplicationExpr>(e)));
  case expr::EXISTS:
    return MP_DISPATCH(VisitExists(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::FORALL:
    return MP_DISPATCH(VisitForAll(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::ALLDIFF:
    return MP_DISPATCH(VisitAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));
  case expr::NOT_ALLDIFF:
    return MP_DISPATCH(VisitNotAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));

    // String expressions.
  case expr::STRING:
    return MP_DISPATCH(VisitStringLiteral(
                         ET::template UncheckedCast<StringLiteral>(e)));
  case expr::IFSYM:
    return MP_DISPATCH(VisitSymbolicIf(
                         ET::template UncheckedCast<SymbolicIfExpr>(e)));
  }
}